

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O1

ssize_t __thiscall
jsoncons::csv::
basic_csv_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
::read(basic_csv_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t extraout_RAX;
  ser_error *this_00;
  undefined8 extraout_RAX_00;
  error_code ec_00;
  error_code ec;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  read_internal(this,&local_20);
  if (local_20._M_value == 0) {
    return extraout_RAX;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_20._M_value;
  ec_00._M_cat = local_20._M_cat;
  ser_error::ser_error(this_00,ec_00,(this->parser_).line_,(this->parser_).column_);
  basic_csv_reader<char,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<char>>
  ::read((basic_csv_reader<char,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<char>>
          *)this_00);
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

void read()
        {
            std::error_code ec;
            read(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
            }
        }